

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  MessageLite *pMVar4;
  LogMessage local_70;
  LogFinisher local_31;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    pMVar4 = (MessageLite *)0x0;
  }
  else {
    if (pEVar2->is_repeated != false) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x2bd);
      pLVar3 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_70);
    }
    CVar1 = anon_unknown_22::cpp_type(pEVar2->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
                 ,0x2bd);
      pLVar3 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar3);
      LogMessage::~LogMessage(&local_70);
    }
    if ((pEVar2->field_0xa & 0x10) == 0) {
      pMVar4 = (MessageLite *)(pEVar2->field_0).repeated_string_value;
      if (this->arena_ != (Arena *)0x0) {
        pMVar4 = (MessageLite *)
                 (*(code *)(((RepeatedPtrFieldBase *)&pMVar4->_vptr_MessageLite)->arena_->impl_).
                           initial_block_)(pMVar4);
        (*(code *)(((RepeatedPtrFieldBase *)&pMVar4->_vptr_MessageLite)->arena_->impl_).options_.
                  initial_block_size)(pMVar4,(pEVar2->field_0).int64_value);
      }
    }
    else {
      pMVar4 = (MessageLite *)
               (*(code *)(((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                          arena_)->impl_).options_.initial_block)
                         ((pEVar2->field_0).repeated_string_value,prototype);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar2->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar2->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,number);
  }
  return pMVar4;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(prototype);
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ == NULL) {
        ret = extension->message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      }
    }
    Erase(number);
    return ret;
  }
}